

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void anon_unknown.dwarf_2e8af7c::AddKnownTx(Peer *peer,uint256 *hash)

{
  TxRelay *pTVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar1 = Peer::GetTxRelay(peer);
  if (pTVar1 != (TxRelay *)0x0) {
    local_28._M_device = &(pTVar1->m_tx_inventory_mutex).super_recursive_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_28);
    vKey.m_size = 0x20;
    vKey.m_data = (uchar *)hash;
    CRollingBloomFilter::insert(&pTVar1->m_tx_inventory_known_filter,vKey);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AddKnownTx(Peer& peer, const uint256& hash)
{
    auto tx_relay = peer.GetTxRelay();
    if (!tx_relay) return;

    LOCK(tx_relay->m_tx_inventory_mutex);
    tx_relay->m_tx_inventory_known_filter.insert(hash);
}